

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_5x5.h
# Opt level: O2

void ncnn::conv5x5s1_sse(Mat *bottom_blob,Mat *top_blob,Mat *_kernel,Mat *_bias)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  uint uVar16;
  int iVar17;
  int iVar18;
  void *pvVar19;
  void *pvVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  int iVar66;
  long lVar67;
  ulong uVar68;
  long lVar69;
  void *pvVar70;
  void *pvVar71;
  ulong uVar72;
  void *pvVar73;
  ulong uVar74;
  void *pvVar75;
  uint uVar76;
  long lVar77;
  void *pvVar78;
  void *pvVar79;
  int remain_1;
  long lVar80;
  long lVar81;
  void *pvVar82;
  ulong uVar83;
  void *pvVar84;
  int remain;
  int iVar85;
  float fVar86;
  Mat out;
  Mat local_90;
  Mat local_60;
  
  lVar77 = (long)bottom_blob->w;
  uVar16 = bottom_blob->c;
  iVar17 = top_blob->w;
  iVar18 = top_blob->h;
  pvVar19 = _kernel->data;
  pvVar20 = _bias->data;
  lVar69 = (long)iVar17;
  uVar83 = 0;
  uVar74 = (ulong)uVar16;
  if ((int)uVar16 < 1) {
    uVar74 = uVar83;
  }
  uVar72 = (ulong)(uint)top_blob->c;
  if (top_blob->c < 1) {
    uVar72 = uVar83;
  }
  lVar81 = (long)(bottom_blob->w + 4) * 4;
  for (; uVar83 != uVar72; uVar83 = uVar83 + 1) {
    Mat::channel(&local_60,top_blob,(int)uVar83);
    if (pvVar20 == (void *)0x0) {
      fVar86 = 0.0;
    }
    else {
      fVar86 = *(float *)((long)pvVar20 + uVar83 * 4);
    }
    Mat::fill(&local_60,fVar86);
    iVar66 = uVar16 * 0x19 * (int)uVar83;
    for (uVar68 = 0; pvVar78 = local_60.data, uVar68 != uVar74; uVar68 = uVar68 + 1) {
      Mat::channel(&local_90,bottom_blob,(int)uVar68);
      pvVar84 = local_90.data;
      Mat::~Mat(&local_90);
      lVar67 = uVar68 * 100;
      pvVar70 = (void *)((long)pvVar84 + lVar77 * 4);
      pvVar71 = (void *)((long)pvVar84 + lVar77 * 8);
      pvVar73 = (void *)((long)pvVar84 + lVar77 * 0xc);
      pvVar75 = (void *)((long)pvVar84 + lVar77 * 0x10);
      pvVar79 = (void *)((long)pvVar84 + lVar77 * 0x14);
      pvVar82 = pvVar78;
      for (uVar76 = 0; (int)(uVar76 | 1) < iVar18; uVar76 = uVar76 + 2) {
        lVar80 = 0;
        for (iVar85 = iVar17; 0 < iVar85; iVar85 = iVar85 + -1) {
          pfVar1 = (float *)((long)pvVar84 + lVar80);
          pfVar2 = (float *)((long)pvVar70 + lVar80);
          fVar21 = *pfVar2;
          fVar22 = pfVar2[1];
          fVar23 = pfVar2[2];
          fVar24 = pfVar2[3];
          pfVar2 = (float *)((long)pvVar71 + lVar80);
          fVar25 = *pfVar2;
          fVar26 = pfVar2[1];
          fVar27 = pfVar2[2];
          fVar28 = pfVar2[3];
          pfVar2 = (float *)((long)pvVar19 + lVar67 + (long)iVar66 * 4);
          fVar29 = *pfVar2;
          fVar30 = pfVar2[1];
          fVar31 = pfVar2[2];
          fVar32 = pfVar2[3];
          pfVar2 = (float *)((long)pvVar19 + lVar67 + (long)iVar66 * 4 + 0x10);
          fVar33 = *pfVar2;
          fVar34 = pfVar2[1];
          fVar35 = pfVar2[2];
          fVar36 = pfVar2[3];
          pfVar2 = (float *)((long)pvVar19 + lVar67 + (long)iVar66 * 4 + 0x20);
          fVar37 = *pfVar2;
          fVar38 = pfVar2[1];
          fVar39 = pfVar2[2];
          fVar40 = pfVar2[3];
          pfVar2 = (float *)((long)pvVar19 + lVar67 + (long)iVar66 * 4 + 0x30);
          fVar41 = *pfVar2;
          fVar42 = pfVar2[1];
          fVar43 = pfVar2[2];
          fVar44 = pfVar2[3];
          fVar86 = *(float *)((long)pvVar70 + lVar80 + 0x10);
          fVar12 = *(float *)((long)pvVar71 + lVar80 + 0x10);
          fVar13 = *(float *)((long)pvVar73 + lVar80);
          pfVar2 = (float *)((long)pvVar73 + lVar80 + 4);
          fVar45 = *pfVar2;
          fVar46 = pfVar2[1];
          fVar47 = pfVar2[2];
          fVar48 = pfVar2[3];
          pfVar2 = (float *)((long)pvVar19 + lVar67 + (long)iVar66 * 4 + 0x40);
          fVar49 = *pfVar2;
          fVar50 = pfVar2[1];
          fVar51 = pfVar2[2];
          fVar52 = pfVar2[3];
          pfVar2 = (float *)((long)pvVar19 + lVar67 + (long)iVar66 * 4 + 0x50);
          fVar53 = *pfVar2;
          fVar54 = pfVar2[1];
          fVar55 = pfVar2[2];
          fVar56 = pfVar2[3];
          pfVar2 = (float *)((long)pvVar75 + lVar80);
          fVar57 = *pfVar2;
          pfVar4 = (float *)((long)pvVar75 + lVar80 + 4);
          fVar58 = *pfVar4;
          fVar59 = pfVar4[1];
          fVar60 = pfVar4[2];
          fVar61 = pfVar4[3];
          pfVar4 = (float *)((long)pvVar79 + lVar80);
          fVar62 = *pfVar4;
          fVar63 = pfVar4[1];
          fVar64 = pfVar4[2];
          fVar65 = pfVar4[3];
          fVar14 = *(float *)((long)pvVar19 + lVar67 + (long)iVar66 * 4 + 0x60);
          fVar15 = *(float *)((long)pvVar79 + lVar80 + 0x10);
          *(float *)((long)pvVar78 + lVar80) =
               fVar23 * fVar36 + fVar13 * fVar44 + fVar26 * fVar40 + pfVar1[3] * fVar32 +
               fVar21 * fVar34 + fVar28 * fVar42 + fVar86 * fVar38 + pfVar1[1] * fVar30 +
               fVar22 * fVar35 + fVar12 * fVar43 + fVar25 * fVar39 + pfVar1[2] * fVar31 +
               *(float *)((long)pvVar84 + lVar80 + 0x10) * fVar33 + fVar27 * fVar41 +
               fVar24 * fVar37 + *pfVar1 * fVar29 +
               fVar52 * fVar48 + fVar56 * pfVar2[3] + fVar50 * fVar46 + fVar54 * pfVar2[1] +
               fVar51 * fVar47 + fVar55 * pfVar2[2] + fVar49 * fVar45 + fVar53 * fVar57 +
               *(float *)((long)pvVar75 + lVar80 + 0x10) * fVar14 +
               *(float *)((long)pvVar78 + lVar80);
          *(float *)((long)pvVar82 + lVar80 + lVar69 * 4) =
               fVar57 * fVar44 + fVar36 * fVar27 + fVar32 * fVar24 + fVar45 * fVar40 +
               fVar47 * fVar42 + fVar34 * fVar25 + fVar30 * fVar22 + fVar12 * fVar38 +
               fVar48 * fVar43 + fVar35 * fVar26 + fVar31 * fVar23 + fVar13 * fVar39 +
               fVar46 * fVar41 + fVar86 * fVar33 + fVar29 * fVar21 + fVar28 * fVar37 +
               fVar61 * fVar52 + fVar65 * fVar56 + fVar59 * fVar50 + fVar63 * fVar54 +
               fVar60 * fVar51 + fVar64 * fVar55 + fVar58 * fVar49 + fVar62 * fVar53 +
               fVar14 * fVar15 + *(float *)((long)pvVar82 + lVar80 + lVar69 * 4);
          lVar80 = lVar80 + 4;
        }
        pvVar84 = (void *)((long)pvVar84 + lVar80 + lVar81);
        pvVar70 = (void *)((long)pvVar70 + lVar80 + lVar81);
        pvVar71 = (void *)((long)pvVar71 + lVar80 + lVar81);
        pvVar73 = (void *)((long)pvVar73 + lVar80 + lVar81);
        pvVar75 = (void *)((long)pvVar75 + lVar80 + lVar81);
        pvVar79 = (void *)((long)pvVar79 + lVar80 + lVar81);
        pvVar78 = (void *)((long)pvVar78 + lVar80 + lVar69 * 4);
        pvVar82 = (void *)((long)pvVar82 + lVar80 + lVar69 * 4);
      }
      for (; (int)uVar76 < iVar18; uVar76 = uVar76 + 1) {
        lVar80 = 0;
        for (iVar85 = iVar17; 0 < iVar85; iVar85 = iVar85 + -1) {
          pfVar1 = (float *)((long)pvVar84 + lVar80);
          pfVar2 = (float *)((long)pvVar70 + lVar80);
          pfVar4 = (float *)((long)pvVar71 + lVar80);
          pfVar11 = (float *)((long)pvVar19 + lVar67 + (long)iVar66 * 4);
          pfVar5 = (float *)((long)pvVar19 + lVar67 + (long)iVar66 * 4 + 0x10);
          pfVar6 = (float *)((long)pvVar19 + lVar67 + (long)iVar66 * 4 + 0x20);
          pfVar7 = (float *)((long)pvVar19 + lVar67 + (long)iVar66 * 4 + 0x30);
          pfVar8 = (float *)((long)pvVar73 + lVar80 + 4);
          pfVar3 = (float *)((long)pvVar75 + lVar80);
          pfVar9 = (float *)((long)pvVar19 + lVar67 + (long)iVar66 * 4 + 0x40);
          pfVar10 = (float *)((long)pvVar19 + lVar67 + (long)iVar66 * 4 + 0x50);
          *(float *)((long)pvVar78 + lVar80) =
               *(float *)((long)pvVar73 + lVar80) * pfVar7[3] + pfVar2[2] * pfVar5[3] +
               pfVar4[1] * pfVar6[3] + pfVar11[3] * pfVar1[3] +
               pfVar4[3] * pfVar7[1] + *pfVar2 * pfVar5[1] +
               *(float *)((long)pvVar70 + lVar80 + 0x10) * pfVar6[1] + pfVar11[1] * pfVar1[1] +
               *(float *)((long)pvVar71 + lVar80 + 0x10) * pfVar7[2] + pfVar2[1] * pfVar5[2] +
               *pfVar4 * pfVar6[2] + pfVar11[2] * pfVar1[2] +
               pfVar4[2] * *pfVar7 + *(float *)((long)pvVar84 + lVar80 + 0x10) * *pfVar5 +
               pfVar2[3] * *pfVar6 + *pfVar11 * *pfVar1 +
               pfVar10[3] * pfVar3[3] + pfVar9[3] * pfVar8[3] +
               pfVar10[1] * pfVar3[1] + pfVar9[1] * pfVar8[1] +
               pfVar10[2] * pfVar3[2] + pfVar9[2] * pfVar8[2] +
               *pfVar10 * *pfVar3 + *pfVar9 * *pfVar8 +
               *(float *)((long)pvVar19 + lVar67 + (long)iVar66 * 4 + 0x60) *
               *(float *)((long)pvVar75 + lVar80 + 0x10) + *(float *)((long)pvVar78 + lVar80);
          lVar80 = lVar80 + 4;
        }
        pvVar84 = (void *)((long)pvVar84 + lVar80 + 0x10);
        pvVar70 = (void *)((long)pvVar70 + lVar80 + 0x10);
        pvVar71 = (void *)((long)pvVar71 + lVar80 + 0x10);
        pvVar73 = (void *)((long)pvVar73 + lVar80 + 0x10);
        pvVar75 = (void *)((long)pvVar75 + lVar80 + 0x10);
        pvVar78 = (void *)((long)pvVar78 + lVar80);
      }
    }
    Mat::~Mat(&local_60);
  }
  return;
}

Assistant:

static void conv5x5s1_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& _kernel, const Mat& _bias)
{
    int w = bottom_blob.w;
    int inch = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    const float* kernel = _kernel;
    const float* bias = _bias;

    #pragma omp parallel for
    for (int p=0; p<outch; p++)
    {
        Mat out = top_blob.channel(p);

        const float bias0 = bias ? bias[p] : 0.f;

        out.fill(bias0);

        for (int q=0; q<inch; q++)
        {
            float* outptr = out;
            float* outptr2 = outptr + outw;

            const float* img0 = bottom_blob.channel(q);

            const float* kernel0 = kernel + p*inch*25  + q*25;

            const float* r0 = img0;
            const float* r1 = img0 + w;
            const float* r2 = img0 + w*2;
            const float* r3 = img0 + w*3;
            const float* r4 = img0 + w*4;
            const float* r5 = img0 + w*5;

            const float* k0 = kernel0;
            const float* k1 = kernel0 + 5;
            const float* k2 = kernel0 + 10;
            const float* k3 = kernel0 + 15;
            const float* k4 = kernel0 + 20;

            int i = 0;

            for (; i+1 < outh; i+=2)
            {

                int remain = outw;

                for (; remain>0; remain--)
                {
                    float sum = 0;
                    float sum2 = 0;

                    sum += r0[0] * k0[0];
                    sum += r0[1] * k0[1];
                    sum += r0[2] * k0[2];
                    sum += r0[3] * k0[3];
                    sum += r0[4] * k0[4];

                    sum += r1[0] * k1[0];
                    sum += r1[1] * k1[1];
                    sum += r1[2] * k1[2];
                    sum += r1[3] * k1[3];
                    sum += r1[4] * k1[4];

                    sum += r2[0] * k2[0];
                    sum += r2[1] * k2[1];
                    sum += r2[2] * k2[2];
                    sum += r2[3] * k2[3];
                    sum += r2[4] * k2[4];

                    sum += r3[0] * k3[0];
                    sum += r3[1] * k3[1];
                    sum += r3[2] * k3[2];
                    sum += r3[3] * k3[3];
                    sum += r3[4] * k3[4];

                    sum += r4[0] * k4[0];
                    sum += r4[1] * k4[1];
                    sum += r4[2] * k4[2];
                    sum += r4[3] * k4[3];
                    sum += r4[4] * k4[4];

                    sum2 += r1[0] * k0[0];
                    sum2 += r1[1] * k0[1];
                    sum2 += r1[2] * k0[2];
                    sum2 += r1[3] * k0[3];
                    sum2 += r1[4] * k0[4];

                    sum2 += r2[0] * k1[0];
                    sum2 += r2[1] * k1[1];
                    sum2 += r2[2] * k1[2];
                    sum2 += r2[3] * k1[3];
                    sum2 += r2[4] * k1[4];

                    sum2 += r3[0] * k2[0];
                    sum2 += r3[1] * k2[1];
                    sum2 += r3[2] * k2[2];
                    sum2 += r3[3] * k2[3];
                    sum2 += r3[4] * k2[4];

                    sum2 += r4[0] * k3[0];
                    sum2 += r4[1] * k3[1];
                    sum2 += r4[2] * k3[2];
                    sum2 += r4[3] * k3[3];
                    sum2 += r4[4] * k3[4];

                    sum2 += r5[0] * k4[0];
                    sum2 += r5[1] * k4[1];
                    sum2 += r5[2] * k4[2];
                    sum2 += r5[3] * k4[3];
                    sum2 += r5[4] * k4[4];

                    *outptr += sum;
                    *outptr2 += sum2;

                    r0++;
                    r1++;
                    r2++;
                    r3++;
                    r4++;
                    r5++;
                    outptr++;
                    outptr2++;
                }

                r0 += 4 + w;
                r1 += 4 + w;
                r2 += 4 + w;
                r3 += 4 + w;
                r4 += 4 + w;
                r5 += 4 + w;

                outptr += outw;
                outptr2 += outw;
            }

            for (; i < outh; i++)
            {

                int remain = outw;

                for (; remain>0; remain--)
                {
                    float sum = 0;

                    sum += r0[0] * k0[0];
                    sum += r0[1] * k0[1];
                    sum += r0[2] * k0[2];
                    sum += r0[3] * k0[3];
                    sum += r0[4] * k0[4];

                    sum += r1[0] * k1[0];
                    sum += r1[1] * k1[1];
                    sum += r1[2] * k1[2];
                    sum += r1[3] * k1[3];
                    sum += r1[4] * k1[4];

                    sum += r2[0] * k2[0];
                    sum += r2[1] * k2[1];
                    sum += r2[2] * k2[2];
                    sum += r2[3] * k2[3];
                    sum += r2[4] * k2[4];

                    sum += r3[0] * k3[0];
                    sum += r3[1] * k3[1];
                    sum += r3[2] * k3[2];
                    sum += r3[3] * k3[3];
                    sum += r3[4] * k3[4];

                    sum += r4[0] * k4[0];
                    sum += r4[1] * k4[1];
                    sum += r4[2] * k4[2];
                    sum += r4[3] * k4[3];
                    sum += r4[4] * k4[4];

                    *outptr += sum;

                    r0++;
                    r1++;
                    r2++;
                    r3++;
                    r4++;
                    outptr++;
                }

                r0 += 4;
                r1 += 4;
                r2 += 4;
                r3 += 4;
                r4 += 4;

            }

        }
    }

}